

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O0

void __thiscall sznet::net::TcpConnection::forceClose(TcpConnection *this)

{
  EventLoop *this_00;
  enable_shared_from_this<sznet::net::TcpConnection> local_70;
  code *local_60;
  undefined8 local_58;
  type local_50;
  Functor local_30;
  TcpConnection *local_10;
  TcpConnection *this_local;
  
  if ((this->m_state == kConnected) || (this->m_state == kDisconnecting)) {
    local_10 = this;
    setState(this,kDisconnecting);
    this_00 = this->m_loop;
    local_60 = forceCloseInLoop;
    local_58 = 0;
    std::enable_shared_from_this<sznet::net::TcpConnection>::shared_from_this(&local_70);
    std::bind<void(sznet::net::TcpConnection::*)(),std::shared_ptr<sznet::net::TcpConnection>>
              (&local_50,(offset_in_TcpConnection_to_subr *)&local_60,
               (shared_ptr<sznet::net::TcpConnection> *)&local_70);
    std::function<void()>::
    function<std::_Bind<void(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>))()>,void>
              ((function<void()> *)&local_30,&local_50);
    EventLoop::queueInLoop(this_00,&local_30);
    std::function<void_()>::~function(&local_30);
    std::_Bind<void_(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>))()>::
    ~_Bind(&local_50);
    std::shared_ptr<sznet::net::TcpConnection>::~shared_ptr
              ((shared_ptr<sznet::net::TcpConnection> *)&local_70);
  }
  return;
}

Assistant:

void TcpConnection::forceClose()
{
	// FIXME: use compare and swap
	if (m_state == kConnected || m_state == kDisconnecting)
	{
		setState(kDisconnecting);
		m_loop->queueInLoop(std::bind(&TcpConnection::forceCloseInLoop, shared_from_this()));
	}
}